

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool run_bitset_container_intersection
                (run_container_t *src_1,bitset_container_t *src_2,container_t **dst)

{
  rle16_t rVar1;
  int *piVar2;
  _Bool _Var3;
  int iVar4;
  uint uVar5;
  array_container_t *paVar6;
  bitset_container_t *pbVar7;
  long *in_RDX;
  int *in_RSI;
  run_container_t *in_RDI;
  array_container_t *newanswer_1;
  uint32_t end_1;
  rle16_t rle_2;
  int32_t rlepos_2;
  uint32_t start_1;
  bitset_container_t *answer_2;
  array_container_t *newanswer;
  uint32_t end;
  rle16_t rle_1;
  int32_t rlepos_1;
  uint32_t start;
  bitset_container_t *answer_1;
  uint32_t runValue;
  uint32_t endofrun;
  rle16_t rle;
  int32_t rlepos;
  array_container_t *answer;
  int32_t card;
  undefined4 in_stack_ffffffffffffff78;
  undefined2 in_stack_ffffffffffffff7c;
  uint16_t in_stack_ffffffffffffff7e;
  bitset_container_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  ushort uVar8;
  int local_70;
  uint32_t local_6c;
  int local_50;
  uint32_t local_4c;
  uint local_40;
  int local_34;
  _Bool local_1;
  
  _Var3 = run_container_is_full(in_RDI);
  if (_Var3) {
    if ((int *)*in_RDX != in_RSI) {
      pbVar7 = bitset_container_clone
                         ((bitset_container_t *)
                          CONCAT26(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      *in_RDX = (long)pbVar7;
    }
    local_1 = true;
  }
  else {
    iVar4 = run_container_cardinality
                      ((run_container_t *)
                       CONCAT26(in_stack_ffffffffffffff7e,
                                CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
    if (iVar4 < 0x1001) {
      paVar6 = array_container_create_given_capacity
                         (CONCAT22(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7c));
      *in_RDX = (long)paVar6;
      if (*in_RDX == 0) {
        local_1 = false;
      }
      else {
        for (local_34 = 0; local_34 < in_RDI->n_runs; local_34 = local_34 + 1) {
          rVar1 = in_RDI->runs[local_34];
          for (local_40 = (uint)rVar1 & 0xffff;
              local_40 <= ((uint)rVar1 & 0xffff) + ((uint)rVar1 >> 0x10); local_40 = local_40 + 1) {
            paVar6->array[paVar6->cardinality] = (uint16_t)local_40;
            _Var3 = bitset_container_contains(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
            paVar6->cardinality = (uint)_Var3 + paVar6->cardinality;
          }
        }
        local_1 = false;
      }
    }
    else if ((int *)*in_RDX == in_RSI) {
      piVar2 = (int *)*in_RDX;
      local_4c = 0;
      for (local_50 = 0; local_50 < in_RDI->n_runs; local_50 = local_50 + 1) {
        rVar1 = in_RDI->runs[local_50];
        uVar5 = (uint)rVar1 & 0xffff;
        bitset_reset_range(*(uint64_t **)(in_RSI + 2),local_4c,uVar5);
        local_4c = uVar5 + ((uint)rVar1 >> 0x10) + 1;
      }
      bitset_reset_range(*(uint64_t **)(in_RSI + 2),local_4c,0x10000);
      iVar4 = bitset_container_compute_cardinality
                        ((bitset_container_t *)
                         CONCAT26(in_stack_ffffffffffffff7e,
                                  CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
      *piVar2 = iVar4;
      if (*in_RSI < 0x1001) {
        paVar6 = array_container_from_bitset(in_stack_ffffffffffffff80);
        if (paVar6 == (array_container_t *)0x0) {
          *in_RDX = 0;
          local_1 = false;
        }
        else {
          *in_RDX = (long)paVar6;
          local_1 = false;
        }
      }
      else {
        local_1 = true;
      }
    }
    else {
      pbVar7 = bitset_container_clone
                         ((bitset_container_t *)
                          CONCAT26(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      *in_RDX = (long)pbVar7;
      if (pbVar7 == (bitset_container_t *)0x0) {
        local_1 = true;
      }
      else {
        local_6c = 0;
        for (local_70 = 0; local_70 < in_RDI->n_runs; local_70 = local_70 + 1) {
          uVar8 = in_RDI->runs[local_70].length;
          uVar5 = (uint)in_RDI->runs[local_70] & 0xffff;
          bitset_reset_range(pbVar7->words,local_6c,uVar5);
          local_6c = uVar5 + uVar8 + 1;
        }
        bitset_reset_range(pbVar7->words,local_6c,0x10000);
        iVar4 = bitset_container_compute_cardinality
                          ((bitset_container_t *)
                           CONCAT26(in_stack_ffffffffffffff7e,
                                    CONCAT24(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)));
        pbVar7->cardinality = iVar4;
        if (pbVar7->cardinality < 0x1001) {
          paVar6 = array_container_from_bitset(in_stack_ffffffffffffff80);
          bitset_container_free((bitset_container_t *)0x127d12);
          if (paVar6 == (array_container_t *)0x0) {
            *in_RDX = 0;
            local_1 = false;
          }
          else {
            *in_RDX = (long)paVar6;
            local_1 = false;
          }
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool run_bitset_container_intersection(const run_container_t *src_1,
                                       const bitset_container_t *src_2,
                                       container_t **dst) {
    if (run_container_is_full(src_1)) {
        if (*dst != src_2) *dst = bitset_container_clone(src_2);
        return true;
    }
    int32_t card = run_container_cardinality(src_1);
    if (card <= DEFAULT_MAX_SIZE) {
        // result can only be an array (assuming that we never make a
        // RunContainer)
        if (card > src_2->cardinality) {
            card = src_2->cardinality;
        }
        array_container_t *answer = array_container_create_given_capacity(card);
        *dst = answer;
        if (*dst == NULL) {
            return false;
        }
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            rle16_t rle = src_1->runs[rlepos];
            uint32_t endofrun = (uint32_t)rle.value + rle.length;
            for (uint32_t runValue = rle.value; runValue <= endofrun;
                 ++runValue) {
                answer->array[answer->cardinality] = (uint16_t)runValue;
                answer->cardinality +=
                    bitset_container_contains(src_2, runValue);
            }
        }
        return false;
    }
    if (*dst == src_2) {  // we attempt in-place
        bitset_container_t *answer = CAST_bitset(*dst);
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(src_2->words, start, end);

            start = end + rle.length + 1;
        }
        bitset_reset_range(src_2->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);
        if (src_2->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(src_2);
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    } else {  // no inplace
        // we expect the answer to be a bitmap (if we are lucky)
        bitset_container_t *answer = bitset_container_clone(src_2);

        *dst = answer;
        if (answer == NULL) {
            return true;
        }
        uint32_t start = 0;
        for (int32_t rlepos = 0; rlepos < src_1->n_runs; ++rlepos) {
            const rle16_t rle = src_1->runs[rlepos];
            uint32_t end = rle.value;
            bitset_reset_range(answer->words, start, end);
            start = end + rle.length + 1;
        }
        bitset_reset_range(answer->words, start, UINT32_C(1) << 16);
        answer->cardinality = bitset_container_compute_cardinality(answer);

        if (answer->cardinality > DEFAULT_MAX_SIZE) {
            return true;
        } else {
            array_container_t *newanswer = array_container_from_bitset(answer);
            bitset_container_free(CAST_bitset(*dst));
            if (newanswer == NULL) {
                *dst = NULL;
                return false;
            }
            *dst = newanswer;
            return false;
        }
    }
}